

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall
Function::Function(Function *this,Visibility visibility,string *name,string *returnType,
                  vector<Variable_*,_std::allocator<Variable_*>_> *params,
                  vector<Variable_*,_std::allocator<Variable_*>_> *localVars,int position)

{
  vector<Variable_*,_std::allocator<Variable_*>_> *localVars_local;
  vector<Variable_*,_std::allocator<Variable_*>_> *params_local;
  string *returnType_local;
  string *name_local;
  Visibility visibility_local;
  Function *this_local;
  
  std::vector<Variable_*,_std::allocator<Variable_*>_>::vector(&this->params);
  std::vector<Variable_*,_std::allocator<Variable_*>_>::vector(&this->localVars);
  std::vector<int,_std::allocator<int>_>::vector(&this->sizes);
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->returnType);
  std::__cxx11::string::string((string *)&this->tag);
  this->visibility = visibility;
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  std::__cxx11::string::operator=((string *)&this->returnType,(string *)returnType);
  std::vector<Variable_*,_std::allocator<Variable_*>_>::operator=(&this->params,params);
  std::vector<Variable_*,_std::allocator<Variable_*>_>::operator=(&this->localVars,localVars);
  this->position = position;
  this->isDefined = false;
  this->offset = 0;
  this->size = 0;
  return;
}

Assistant:

Function::Function(Enums::Visibility visibility, std::string name, std::string returnType, std::vector<Variable *> params,
                   std::vector<Variable *> localVars, int position) {
    this->visibility = visibility;
    this->name = std::move(name);
    this->returnType = std::move(returnType);
    this->params = std::move(params);
    this->localVars = std::move(localVars);
    this->position = position;
    this->isDefined = false;
    this->offset = 0;
    this->size = 0;
}